

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

int event_base_update_cache_time(event_base *base)

{
  int iVar1;
  
  if ((base == (event_base *)0x0) &&
     (base = event_global_current_base_, event_global_current_base_ == (event_base *)0x0)) {
    iVar1 = -1;
  }
  else {
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,base->th_base_lock);
    }
    if ((base->running_loop != 0) &&
       ((base->tv_cache).tv_sec = 0, (base->flags & EVENT_BASE_FLAG_NO_CACHE_TIME) == 0)) {
      gettime(base,&base->tv_cache);
    }
    if (base->th_base_lock == (void *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = 0;
      (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
    }
  }
  return iVar1;
}

Assistant:

int
event_base_update_cache_time(struct event_base *base)
{

	if (!base) {
		base = current_base;
		if (!current_base)
			return -1;
	}

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	if (base->running_loop)
		update_time_cache(base);
	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return 0;
}